

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O0

void __thiscall
ParsedAACTrackData::ParsedAACTrackData(ParsedAACTrackData *this,uint8_t *buff,int size)

{
  int size_local;
  uint8_t *buff_local;
  ParsedAACTrackData *this_local;
  
  ParsedTrackPrivData::ParsedTrackPrivData(&this->super_ParsedTrackPrivData,buff,size);
  (this->super_ParsedTrackPrivData)._vptr_ParsedTrackPrivData =
       (_func_int **)&PTR__ParsedAACTrackData_004413c0;
  AACCodec::AACCodec(&this->m_aacRaw);
  (this->m_aacRaw).m_id = 1;
  (this->m_aacRaw).m_layer = 0;
  (this->m_aacRaw).m_rdb = '\0';
  AACCodec::readConfig(&this->m_aacRaw,buff,size);
  return;
}

Assistant:

ParsedAACTrackData::ParsedAACTrackData(uint8_t* buff, const int size) : ParsedTrackPrivData(buff, size)
{
    m_aacRaw.m_id = 1;  // MPEG2
    m_aacRaw.m_layer = 0;
    m_aacRaw.m_rdb = 0;
    m_aacRaw.readConfig(buff, size);
}